

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::updateRowDualImpliedBounds
          (HPresolve *this,HighsInt row,HighsInt col,double val)

{
  reference pvVar1;
  HighsLinearSumBounds *pHVar2;
  reference pvVar3;
  int in_EDX;
  long *in_RDI;
  double dVar4;
  anon_class_16_2_094d78d8 checkImpliedBound;
  double threshold;
  double dualRowUpper;
  double dualRowLower;
  double impliedMargin;
  anon_class_16_2_094d78d8 *local_78;
  value_type vVar5;
  double coefficient;
  value_type in_stack_ffffffffffffffa0;
  HighsLinearSumBounds *this_00;
  long *plVar6;
  undefined1 *val_00;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x29),(long)in_EDX);
  if (*pvVar1 == 1) {
    pHVar2 = (HighsLinearSumBounds *)(in_RDI[4] ^ 0x8000000000000000);
  }
  else {
    pHVar2 = (HighsLinearSumBounds *)in_RDI[4];
  }
  this_00 = pHVar2;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_EDX);
  if ((*pvVar3 != -INFINITY) || (NAN(*pvVar3))) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),(long)in_EDX);
    in_stack_ffffffffffffffa0 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_EDX);
    if (*pvVar3 + (double)pHVar2 < in_stack_ffffffffffffffa0) goto LAB_006ef39b;
    vVar5 = -INFINITY;
  }
  else {
LAB_006ef39b:
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)in_EDX);
    vVar5 = *pvVar3;
  }
  coefficient = vVar5;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)in_EDX);
  if ((*pvVar3 != INFINITY) || (NAN(*pvVar3))) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),(long)in_EDX);
    dVar4 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)in_EDX);
    if (*pvVar3 - (double)pHVar2 <= dVar4) {
      local_78 = (anon_class_16_2_094d78d8 *)0x7ff0000000000000;
      goto LAB_006ef49b;
    }
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)in_EDX);
  local_78 = (anon_class_16_2_094d78d8 *)*pvVar3;
LAB_006ef49b:
  dVar4 = *(double *)(in_RDI[1] + 0x120) * 1000.0;
  val_00 = &stack0xffffffffffffffc8;
  plVar6 = in_RDI;
  if (((double)local_78 != INFINITY) || (NAN((double)local_78))) {
    HighsLinearSumBounds::getResidualSumLowerOrig
              (this_00,(HighsInt)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
               SUB84(in_stack_ffffffffffffffa0,0),coefficient);
    updateRowDualImpliedBounds::anon_class_16_2_094d78d8::operator()
              (local_78,(HighsInt)((ulong)dVar4 >> 0x20),SUB84(dVar4,0),(double)val_00,
               (double)plVar6,(double)in_RDI,(HighsInt)((ulong)this_00 >> 0x20));
  }
  if ((vVar5 != -INFINITY) || (NAN(vVar5))) {
    HighsLinearSumBounds::getResidualSumUpperOrig
              (this_00,(HighsInt)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
               SUB84(in_stack_ffffffffffffffa0,0),coefficient);
    updateRowDualImpliedBounds::anon_class_16_2_094d78d8::operator()
              (local_78,(HighsInt)((ulong)dVar4 >> 0x20),SUB84(dVar4,0),(double)val_00,
               (double)plVar6,(double)in_RDI,(HighsInt)((ulong)this_00 >> 0x20));
  }
  return;
}

Assistant:

void HPresolve::updateRowDualImpliedBounds(HighsInt row, HighsInt col,
                                           double val) {
  // propagate implied row dual bound
  // if the column has an infinite lower bound the reduced cost cannot be
  // positive, i.e. the column corresponds to a <= constraint in the dual with
  // right hand side -cost which becomes a >= constraint with side +cost.
  // Furthermore, we can ignore strictly redundant primal
  // column bounds and treat them as if they are infinite
  double impliedMargin = colsize[col] != 1 ? primal_feastol : -primal_feastol;
  double dualRowLower =
      (model->col_lower_[col] == -kHighsInf) ||
              (implColLower[col] > model->col_lower_[col] + impliedMargin)
          ? model->col_cost_[col]
          : -kHighsInf;

  double dualRowUpper =
      (model->col_upper_[col] == kHighsInf) ||
              (implColUpper[col] < model->col_upper_[col] - impliedMargin)
          ? model->col_cost_[col]
          : kHighsInf;

  const double threshold = 1000 * options->dual_feasibility_tolerance;

  auto checkImpliedBound = [&](HighsInt row, HighsInt col, double val,
                               double dualRowBnd, double residualAct,
                               HighsInt direction) {
    if (direction * residualAct <= -kHighsInf) return;
    double impliedBound = static_cast<double>(
        (static_cast<HighsCDouble>(dualRowBnd) - residualAct) / val);

    if (std::abs(impliedBound) * kHighsTiny >
        options->dual_feasibility_tolerance)
      return;

    if (direction * val > 0) {
      // only tighten bound if it is tighter by a wide enough margin
      if (impliedBound < implRowDualUpper[row] - threshold)
        changeImplRowDualUpper(row, impliedBound, col);
    } else {
      if (impliedBound > implRowDualLower[row] + threshold)
        changeImplRowDualLower(row, impliedBound, col);
    }
  };

  if (dualRowUpper != kHighsInf)
    checkImpliedBound(
        row, col, val, dualRowUpper,
        impliedDualRowBounds.getResidualSumLowerOrig(col, row, val),
        HighsInt{1});

  if (dualRowLower != -kHighsInf)
    checkImpliedBound(
        row, col, val, dualRowLower,
        impliedDualRowBounds.getResidualSumUpperOrig(col, row, val),
        HighsInt{-1});
}